

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

void nn_cinproc_connect(nn_ins_item *self,nn_ins_item *peer)

{
  nn_ep *pnVar1;
  nn_sinproc *owner;
  void *pvVar2;
  nn_sinproc *pnVar3;
  long in_RSI;
  long in_RDI;
  nn_sinproc *sinproc;
  nn_binproc *binproc;
  nn_cinproc *cinproc;
  nn_fsm *peer_00;
  nn_ep *ep;
  
  if (in_RDI == 0) {
    pnVar1 = (nn_ep *)0x0;
  }
  else {
    pnVar1 = (nn_ep *)(in_RDI + -0x60);
  }
  if (in_RSI == 0) {
    owner = (nn_sinproc *)0x0;
  }
  else {
    owner = (nn_sinproc *)(in_RSI + -0x60);
  }
  if (pnVar1->state != 2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)pnVar1->state,
            "NN_CINPROC_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
            ,0x72);
    fflush(_stderr);
    nn_err_abort();
  }
  ep = pnVar1;
  pnVar3 = owner;
  pvVar2 = nn_alloc_(0x303346);
  if (pvVar2 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
            ,0x75);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_sinproc_init(pnVar3,(int)((ulong)pvVar2 >> 0x20),ep,&owner->fsm);
  peer_00 = (nn_fsm *)&(pnVar1->item).prev;
  pnVar3 = (nn_sinproc *)((long)pvVar2 + 0x280);
  nn_list_end((nn_list *)&(pnVar1->item).prev);
  nn_list_insert((nn_list *)ep,(nn_list_item *)owner,(nn_list_item *)pnVar3);
  nn_sinproc_connect(pnVar3,peer_00);
  nn_ep_stat_increment((nn_ep *)pnVar3,(int)((ulong)peer_00 >> 0x20),(int)peer_00);
  nn_ep_stat_increment((nn_ep *)pnVar3,(int)((ulong)peer_00 >> 0x20),(int)peer_00);
  return;
}

Assistant:

static void nn_cinproc_connect (struct nn_ins_item *self,
    struct nn_ins_item *peer)
{
    struct nn_cinproc *cinproc;
    struct nn_binproc *binproc;
    struct nn_sinproc *sinproc;

    cinproc = nn_cont (self, struct nn_cinproc, item);
    binproc = nn_cont (peer, struct nn_binproc, item);

    nn_assert_state (cinproc, NN_CINPROC_STATE_ACTIVE);

    sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
    alloc_assert (sinproc);
    nn_sinproc_init (sinproc, NN_CINPROC_SRC_SINPROC,
        cinproc->item.ep, &cinproc->fsm);

    nn_list_insert (&cinproc->sinprocs, &sinproc->item,
        nn_list_end (&cinproc->sinprocs));

    nn_sinproc_connect (sinproc, &binproc->fsm);

    nn_ep_stat_increment (cinproc->item.ep, NN_STAT_INPROGRESS_CONNECTIONS, -1);
    nn_ep_stat_increment (cinproc->item.ep, NN_STAT_ESTABLISHED_CONNECTIONS, 1);
}